

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O2

int SUNNonlinSolGetCurIter_FixedPoint(SUNNonlinearSolver NLS,int *iter)

{
  if (NLS != (SUNNonlinearSolver)0x0) {
    *iter = *(int *)((long)NLS->content + 0x90);
    return 0;
  }
  return -0x385;
}

Assistant:

int SUNNonlinSolGetCurIter_FixedPoint(SUNNonlinearSolver NLS, int *iter)
{
  /* check that the nonlinear solver is non-null */
  if (NLS == NULL)
    return(SUN_NLS_MEM_NULL);

  /* return the current nonlinear solver iteration count */
  *iter = FP_CONTENT(NLS)->curiter;
  return(SUN_NLS_SUCCESS);
}